

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall dgPolyhedra::RefineTriangulation(dgPolyhedra *this,HaF64 *vertex,HaI32 stride)

{
  int iVar1;
  dgTreeNode *this_00;
  ulong uVar2;
  dgPolyhedra *pdVar3;
  dgRedBackNode *pdVar4;
  uint perimeterCount;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Iterator iter;
  dgBigVector normal;
  dgEdge *edgePerimeters [16384];
  Iterator IStack_20058;
  dgBigVector dStack_20048;
  dgEdge *apdStack_20028 [16384];
  
  IStack_20058.m_ptr = (dgRedBackNode *)0x0;
  this_00 = (this->super_dgTree<dgEdge,_long>).m_head;
  perimeterCount = 0;
  pdVar3 = (dgPolyhedra *)vertex;
  IStack_20058.m_tree = &this->super_dgTree<dgEdge,_long>;
  if (this_00 == (dgTreeNode *)0x0) {
    IStack_20058.m_ptr = (dgRedBackNode *)0x0;
  }
  else {
    IStack_20058.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
  }
  if (IStack_20058.m_ptr != (dgRedBackNode *)0x0) {
    perimeterCount = 0;
    do {
      iVar1 = *(int *)((long)&IStack_20058.m_ptr[1]._vptr_dgRedBackNode + 4);
      if (iVar1 < 0) {
        uVar2 = 0x3fff;
        if (0x3fff < (int)perimeterCount) {
          uVar2 = (ulong)perimeterCount;
        }
        pdVar3 = (dgPolyhedra *)0x0;
        pdVar4 = IStack_20058.m_ptr + 1;
        do {
          apdStack_20028
          [(long)&(pdVar3->super_dgTree<dgEdge,_long>)._vptr_dgTree + (long)(int)perimeterCount] =
               *(dgEdge **)&pdVar4->field_0x20;
          if ((dgPolyhedra *)(uVar2 - (long)(int)perimeterCount) == pdVar3) {
            __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                          ,0xd2b,
                          "void dgPolyhedra::RefineTriangulation(const hacd::HaF64 *const, hacd::HaI32)"
                         );
          }
          pdVar4 = pdVar4->m_parent;
          pdVar3 = (dgPolyhedra *)((long)&(pdVar3->super_dgTree<dgEdge,_long>)._vptr_dgTree + 1);
        } while (pdVar4 != IStack_20058.m_ptr + 1);
        perimeterCount = perimeterCount + (int)pdVar3;
      }
      if (iVar1 < 0) break;
      pdVar3 = (dgPolyhedra *)0x0;
      dgTree<dgEdge,_long>::Iterator::operator++(&IStack_20058,0);
    } while (IStack_20058.m_ptr != (dgRedBackNode *)0x0);
  }
  if (perimeterCount == 0) {
    __assert_fail("perimeterCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xd31,
                  "void dgPolyhedra::RefineTriangulation(const hacd::HaF64 *const, hacd::HaI32)");
  }
  if ((int)perimeterCount < 0x4000) {
    apdStack_20028[(int)perimeterCount] = apdStack_20028[0];
    FaceNormal(&dStack_20048,pdVar3,apdStack_20028[0],vertex,stride * 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_x;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_y *
                   dStack_20048.super_dgTemplateVector<double>.m_y;
    auVar5 = vfmadd231sd_fma(auVar7,auVar5,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_z;
    auVar5 = vfmadd213sd_fma(auVar6,auVar6,auVar5);
    if (9.999999960041972e-13 < auVar5._0_8_) {
      RefineTriangulation(this,vertex,stride,&dStack_20048,perimeterCount,apdStack_20028);
    }
    return;
  }
  __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                ,0xd32,
                "void dgPolyhedra::RefineTriangulation(const hacd::HaF64 *const, hacd::HaI32)");
}

Assistant:

void dgPolyhedra::RefineTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 stride)
{
	dgEdge* edgePerimeters[1024 * 16];
	hacd::HaI32 perimeterCount = 0;

	dgPolyhedra::Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_incidentFace < 0) {
			dgEdge* ptr = edge;
			do {
				edgePerimeters[perimeterCount] = ptr->m_twin;
				perimeterCount ++;
				HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0])));
				ptr = ptr->m_prev;
			} while (ptr != edge);
			break;
		}
	}
	HACD_ASSERT (perimeterCount);
	HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0])));
	edgePerimeters[perimeterCount] = edgePerimeters[0];

	dgBigVector normal (FaceNormal(edgePerimeters[0], vertex, hacd::HaI32 (stride * sizeof (hacd::HaF64))));
	if ((normal % normal) > hacd::HaF32 (1.0e-12f)) {
		RefineTriangulation (vertex, stride, &normal, perimeterCount, edgePerimeters);
	}
}